

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventFactory.cpp
# Opt level: O0

IEvent * tiger::trains::world::EventFactory::createEvent(EventModel *model,Train *source)

{
  EventType EVar1;
  Train *in_RSI;
  TrainCollisionEven *in_RDI;
  World *in_stack_ffffffffffffffd0;
  EventModel *in_stack_ffffffffffffffd8;
  Train *in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  EVar1 = models::EventModel::getType((EventModel *)in_RDI);
  if (EVar1 == TRAIN_COLLISION) {
    local_8 = (IEvent *)operator_new(0x28);
    events::TrainCollisionEven::TrainCollisionEven
              (in_RDI,(EventModel *)in_RSI,in_stack_ffffffffffffffe0);
  }
  else {
    local_8 = (IEvent *)operator_new(0x18);
    Train::getWorld(in_RSI);
    events::BaseEvent::BaseEvent
              ((BaseEvent *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd0);
  }
  return local_8;
}

Assistant:

IEvent *EventFactory::createEvent(const models::EventModel &model, Train *source)
{
    switch (model.getType())
    {

    case models::EventType::TRAIN_COLLISION:
        return new events::TrainCollisionEven(model, source);

    default:
        return new events::BaseEvent(model, source->getWorld());
    }
}